

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall MxxColl_GathervGeneral_Test::TestBody(MxxColl_GathervGeneral_Test *this)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer __n;
  reference pvVar4;
  reference pvVar5;
  reference out;
  char *pcVar6;
  AssertHelper local_260;
  Message local_258;
  size_type local_250;
  undefined4 local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_6;
  Message local_228;
  int local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_5;
  int j_2;
  int i_4;
  size_t pos_2;
  Message local_1f0;
  size_type local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_4;
  vector<int,_std::allocator<int>_> local_1b0;
  AssertHelper local_198;
  Message local_190;
  size_type local_188;
  undefined4 local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  Message local_160;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  int j_1;
  int i_3;
  size_t pos_1;
  Message local_128;
  size_type local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e8;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  int j;
  int i_2;
  size_t pos;
  size_type sStack_a8;
  int i_1;
  size_t total_size;
  vector<int,_std::allocator<int>_> all;
  size_t i;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> els;
  size_t size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  comm c;
  MxxColl_GathervGeneral_Test *this_local;
  
  this_00 = &recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  mxx::comm::comm((comm *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size);
  iVar2 = mxx::comm::rank((comm *)this_00);
  __n = (pointer)(long)(iVar2 * 5 + 10);
  std::allocator<int>::allocator((allocator<int> *)((long)&i + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,(size_type)__n,
             (allocator<int> *)((long)&i + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&i + 7));
  for (all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage < __n;
      all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    iVar3 = mxx::comm::rank((comm *)&recv_sizes.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar2 = (int)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_78,
                        (size_type)
                        all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    *pvVar4 = iVar3 * 0xd + iVar2 * -0x2a;
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&total_size);
  sStack_a8 = 0;
  iVar2 = mxx::comm::rank((comm *)&recv_sizes.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == 0) {
    iVar2 = mxx::comm::size((comm *)&recv_sizes.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,(long)iVar2);
    for (pos._4_4_ = 0;
        iVar2 = mxx::comm::size((comm *)&recv_sizes.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
        pos._4_4_ < iVar2; pos._4_4_ = pos._4_4_ + 1) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,
                          (long)pos._4_4_);
      *pvVar5 = (long)((pos._4_4_ + 2) * 5);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,
                          (long)pos._4_4_);
      sStack_a8 = *pvVar5 + sStack_a8;
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&total_size,sStack_a8);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_78,0);
  out = std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)&total_size,0);
  mxx::gatherv<int>(pvVar4,(size_t)__n,out,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,0,
                    (comm *)&recv_sizes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar2 = mxx::comm::rank((comm *)&recv_sizes.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == 0) {
    _j = 0;
    for (gtest_ar.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar.message_.ptr_._4_4_,
        iVar3 = mxx::comm::size((comm *)&recv_sizes.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
        iVar2 < iVar3; gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
      for (gtest_ar.message_.ptr_._0_4_ = 0;
          SBORROW4((int)gtest_ar.message_.ptr_,(gtest_ar.message_.ptr_._4_4_ + 2) * 5) !=
          (int)gtest_ar.message_.ptr_ + (gtest_ar.message_.ptr_._4_4_ + 2) * -5 < 0;
          gtest_ar.message_.ptr_._0_4_ = (int)gtest_ar.message_.ptr_ + 1) {
        local_d4 = gtest_ar.message_.ptr_._4_4_ * 0xd + (int)gtest_ar.message_.ptr_ * -0x2a;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&total_size,_j);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_d0,"i*13 - 42*j","all[pos++]",&local_d4,pvVar4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
        if (!bVar1) {
          testing::Message::Message(&local_e0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                     ,0x14d,pcVar6);
          testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
          testing::internal::AssertHelper::~AssertHelper(&local_e8);
          testing::Message::~Message(&local_e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
        if (!bVar1) goto LAB_001afb5f;
        _j = _j + 1;
      }
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_78,0);
  mxx::gatherv<int>((vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_,pvVar4,(size_t)__n,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,0,
                    (comm *)&recv_sizes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&total_size,
             (vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_);
  iVar2 = mxx::comm::rank((comm *)&recv_sizes.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == 0) {
    local_120 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&total_size);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_118,"total_size","all.size()",&stack0xffffffffffffff58,
               &local_120);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pos_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                 ,0x154,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pos_1,&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pos_1);
      testing::Message::~Message(&local_128);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (!bVar1) goto LAB_001afb5f;
    _j_1 = 0;
    for (gtest_ar_2.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar_2.message_.ptr_._4_4_,
        iVar3 = mxx::comm::size((comm *)&recv_sizes.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
        iVar2 < iVar3; gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1) {
      for (gtest_ar_2.message_.ptr_._0_4_ = 0;
          SBORROW4((int)gtest_ar_2.message_.ptr_,(gtest_ar_2.message_.ptr_._4_4_ + 2) * 5) !=
          (int)gtest_ar_2.message_.ptr_ + (gtest_ar_2.message_.ptr_._4_4_ + 2) * -5 < 0;
          gtest_ar_2.message_.ptr_._0_4_ = (int)gtest_ar_2.message_.ptr_ + 1) {
        local_154 = gtest_ar_2.message_.ptr_._4_4_ * 0xd + (int)gtest_ar_2.message_.ptr_ * -0x2a;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&total_size,_j_1);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_150,"i*13 - 42*j","all[pos++]",&local_154,pvVar4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
        if (!bVar1) {
          testing::Message::Message(&local_160);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                     ,0x158,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_160);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_160);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
        if (!bVar1) goto LAB_001afb5f;
        _j_1 = _j_1 + 1;
      }
    }
  }
  else {
    local_17c = 0;
    local_188 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&total_size);
    testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
              (local_178,"0u",(uint *)0x24b3aa,(unsigned_long *)&local_17c,&local_188);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                 ,0x15c,pcVar6);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
    if (!bVar1) goto LAB_001afb5f;
  }
  mxx::comm::comm((comm *)&gtest_ar_4.message_);
  mxx::gatherv<int>(&local_1b0,(vector<int,_std::allocator<int>_> *)local_78,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,0,
                    (comm *)&gtest_ar_4.message_);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&total_size,&local_1b0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_1b0);
  mxx::comm::~comm((comm *)&gtest_ar_4.message_);
  iVar2 = mxx::comm::rank((comm *)&recv_sizes.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == 0) {
    local_1e8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&total_size);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_1e0,"total_size","all.size()",&stack0xffffffffffffff58,
               &local_1e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pos_2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                 ,0x161,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pos_2,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pos_2);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
    if (bVar1) {
      _j_2 = 0;
      for (gtest_ar_5.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar_5.message_.ptr_._4_4_,
          iVar3 = mxx::comm::size((comm *)&recv_sizes.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
          iVar2 < iVar3; gtest_ar_5.message_.ptr_._4_4_ = gtest_ar_5.message_.ptr_._4_4_ + 1) {
        for (gtest_ar_5.message_.ptr_._0_4_ = 0;
            SBORROW4((int)gtest_ar_5.message_.ptr_,(gtest_ar_5.message_.ptr_._4_4_ + 2) * 5) !=
            (int)gtest_ar_5.message_.ptr_ + (gtest_ar_5.message_.ptr_._4_4_ + 2) * -5 < 0;
            gtest_ar_5.message_.ptr_._0_4_ = (int)gtest_ar_5.message_.ptr_ + 1) {
          local_21c = gtest_ar_5.message_.ptr_._4_4_ * 0xd + (int)gtest_ar_5.message_.ptr_ * -0x2a;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&total_size,_j_2);
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_218,"i*13 - 42*j","all[pos++]",&local_21c,pvVar4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
          if (!bVar1) {
            testing::Message::Message(&local_228);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                       ,0x165,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_228);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_228);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
          if (!bVar1) goto LAB_001afb5f;
          _j_2 = _j_2 + 1;
        }
      }
    }
  }
  else {
    local_244 = 0;
    local_250 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&total_size);
    testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
              (local_240,"0u",(uint *)0x24b3aa,(unsigned_long *)&local_244,&local_250);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                 ,0x169,pcVar6);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  }
LAB_001afb5f:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&total_size);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size);
  mxx::comm::~comm((comm *)&recv_sizes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(MxxColl, GathervGeneral) {
    mxx::comm c;
    std::vector<size_t> recv_sizes;
    // fill elements
    size_t size = 5*(c.rank()+2);
    std::vector<int> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = c.rank()*13 - 42*i;
    }
    std::vector<int> all;
    size_t total_size = 0;
    if (c.rank() == 0) {
        // prepare recv sizes and output vector
        recv_sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            recv_sizes[i] = 5*(i+2);
            total_size += recv_sizes[i];
        }
        all.resize(total_size);
    }

    // general gatherv
    mxx::gatherv(&els[0], size, &all[0], recv_sizes, 0, c);
    if (c.rank() == 0) {
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    }
    // convenience functions
    all = mxx::gatherv(&els[0], size, recv_sizes, 0, c);
    if (c.rank() == 0) {
        ASSERT_EQ(total_size, all.size());
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    } else {
        ASSERT_EQ(0u, all.size());
    }
    // convenience functions
    all = mxx::gatherv(els, recv_sizes, 0);
    if (c.rank() == 0) {
        ASSERT_EQ(total_size, all.size());
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    } else {
        ASSERT_EQ(0u, all.size());
    }
}